

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O2

void __thiscall
Secp256k1_CombinePubkeySecp256k1EcErrorCaseTest_Test::TestBody
          (Secp256k1_CombinePubkeySecp256k1EcErrorCaseTest_Test *this)

{
  pointer paVar1;
  bool bVar2;
  secp256k1_context_struct *context;
  pointer paVar3;
  AssertHelper local_90;
  Secp256k1 secp;
  ByteData actual;
  CombinePubkeyTestVector test_vector;
  
  context = wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1(&secp,context);
  paVar1 = combine_error_vectors.
           super__Vector_base<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (paVar3 = combine_error_vectors.
                super__Vector_base<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>
                ._M_impl.super__Vector_impl_data._M_start; paVar3 != paVar1; paVar3 = paVar3 + 1) {
    anon_struct_56_2_5c921040::CombinePubkeyTestVector(&test_vector,paVar3);
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Secp256k1::CombinePubkeySecp256k1Ec(&actual,&secp,&test_vector.pubkeys);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&actual);
    }
    testing::Message::Message((Message *)&actual);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_secp256k1.cpp"
               ,0x9c,
               "Expected: ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector.pubkeys) throws an exception of type CfdException.\n  Actual: it throws nothing."
              );
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&actual);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&actual);
    anon_struct_56_2_5c921040::~CombinePubkeyTestVector(&test_vector);
  }
  return;
}

Assistant:

TEST(Secp256k1, CombinePubkeySecp256k1EcErrorCaseTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (CombinePubkeyTestVector test_vector : combine_error_vectors) {
    EXPECT_THROW(
        ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector.pubkeys),
        CfdException);
  }
}